

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ConstIterators_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ConstIterators_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator it_00;
  bool bVar1;
  undefined1 uVar2;
  char *in_RDI;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  const_iterator it;
  undefined4 uVar3;
  int in_stack_fffffffffffffe7c;
  undefined4 uVar4;
  HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe80;
  dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *message;
  int line;
  string local_158 [4];
  Type in_stack_fffffffffffffeac;
  AssertHelper *in_stack_fffffffffffffeb0;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffec0;
  pointer in_stack_fffffffffffffee0;
  pointer in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffff00;
  string local_f0 [64];
  const_iterator local_b0;
  undefined1 local_89;
  AssertionResult local_88;
  undefined8 local_78;
  dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_70;
  pointer local_68;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_60;
  const_iterator local_58 [2];
  value_type local_c;
  
  line = (int)((ulong)(in_RDI + 0x10) >> 0x20);
  local_c = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffff00,
           (value_type *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffffec0);
  uVar3 = (undefined4)local_78;
  uVar4 = (undefined4)((ulong)local_78 >> 0x20);
  it_00.super_iterator.pos = (pointer)local_70;
  it_00.super_iterator.ht =
       (dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)local_78;
  it_00.super_iterator.end = local_68;
  it_00.parent_ = local_60;
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_iterator::const_iterator(local_58,it_00);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffec0);
  local_89 = google::
             dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             ::operator!=(&local_58[0].super_const_iterator,&local_b0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_70,(bool *)CONCAT44(uVar4,uVar3),(type *)0xa9c15d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_88);
  this_00 = local_70;
  message = local_60;
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
               in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8,
               (char *)in_stack_fffffffffffffee0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_RDI,line,(char *)local_60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff00,
               (Message *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_70);
    std::__cxx11::string::~string(local_f0);
    testing::Message::~Message((Message *)0xa9c21e);
    this_00 = local_70;
    message = local_60;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xa9c2b2);
  google::
  dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++(this_00);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffec0);
  uVar2 = google::
          dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&local_58[0].super_const_iterator,(const_iterator *)&stack0xfffffffffffffed8)
  ;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)CONCAT44(uVar4,uVar3),(type *)0xa9c306);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff00);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(uVar2,in_stack_fffffffffffffef8),
               in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8,
               (char *)in_stack_fffffffffffffee0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_RDI,line,(char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff00,
               (Message *)CONCAT17(uVar2,in_stack_fffffffffffffef8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_158);
    testing::Message::~Message((Message *)0xa9c3be);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xa9c443);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ConstIterators) {
  this->ht_.insert(this->UniqueObject(1));
  typename TypeParam::const_iterator it = this->ht_.begin();
  EXPECT_TRUE(it != this->ht_.end());
  ++it;
  EXPECT_TRUE(it == this->ht_.end());
}